

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O0

void __thiscall zmq::zmtp_engine_t::plug_internal(zmtp_engine_t *this)

{
  size_t sVar1;
  stream_engine_base_t *in_RDI;
  
  stream_engine_base_t::set_handshake_timer(in_RDI);
  in_RDI->_outpos = in_RDI[1]._options.routing_id + 0x9f;
  sVar1 = in_RDI->_outsize;
  in_RDI->_outsize = sVar1 + 1;
  in_RDI->_outpos[sVar1] = 0xff;
  put_uint64(in_RDI->_outpos + in_RDI->_outsize,(long)(int)((in_RDI->_options).routing_id_size + 1))
  ;
  in_RDI->_outsize = in_RDI->_outsize + 8;
  sVar1 = in_RDI->_outsize;
  in_RDI->_outsize = sVar1 + 1;
  in_RDI->_outpos[sVar1] = '\x7f';
  stream_engine_base_t::set_pollin((stream_engine_base_t *)0x310f17);
  stream_engine_base_t::set_pollout((stream_engine_base_t *)0x310f21);
  stream_engine_base_t::in_event(in_RDI);
  return;
}

Assistant:

void zmq::zmtp_engine_t::plug_internal ()
{
    // start optional timer, to prevent handshake hanging on no input
    set_handshake_timer ();

    //  Send the 'length' and 'flags' fields of the routing id message.
    //  The 'length' field is encoded in the long format.
    _outpos = _greeting_send;
    _outpos[_outsize++] = UCHAR_MAX;
    put_uint64 (&_outpos[_outsize], _options.routing_id_size + 1);
    _outsize += 8;
    _outpos[_outsize++] = 0x7f;

    set_pollin ();
    set_pollout ();
    //  Flush all the data that may have been already received downstream.
    in_event ();
}